

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::Array<unsigned_char>_>::setCapacity
          (Vector<kj::Array<unsigned_char>_> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<kj::Array<unsigned_char>_> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x18)) {
    ArrayBuilder<kj::Array<unsigned_char>_>::truncate(&this->builder,(char *)newSize,lVar1 % 0x18);
  }
  newBuilder.ptr = _::HeapArrayDisposer::allocateUninitialized<kj::Array<unsigned_char>>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<kj::Array<unsigned_char>>::addAll<kj::ArrayBuilder<kj::Array<unsigned_char>>>
            ((ArrayBuilder<kj::Array<unsigned_char>> *)&newBuilder,&this->builder);
  ArrayBuilder<kj::Array<unsigned_char>_>::operator=(&this->builder,&newBuilder);
  ArrayBuilder<kj::Array<unsigned_char>_>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }